

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  uint uVar1;
  size_t bytes;
  void *__dest;
  U32 *pUVar2;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  void *internalBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  ZSTD_CDict *cdict_local;
  
  (cdict->matchState).cParams.windowLog = params.cParams.windowLog;
  (cdict->matchState).cParams.chainLog = params.cParams.chainLog;
  (cdict->matchState).cParams.hashLog = params.cParams.hashLog;
  (cdict->matchState).cParams.searchLog = params.cParams.searchLog;
  (cdict->matchState).cParams.minMatch = params.cParams.minMatch;
  (cdict->matchState).cParams.targetLength = params.cParams.targetLength;
  (cdict->matchState).cParams.strategy = params.cParams.strategy;
  (cdict->matchState).dedicatedDictSearch = params.enableDedicatedDictSearch;
  if (((dictLoadMethod == ZSTD_dlm_byRef) || (dictBuffer == (void *)0x0)) || (dictSize == 0)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    bytes = ZSTD_cwksp_align(dictSize,8);
    __dest = ZSTD_cwksp_reserve_object(&cdict->workspace,bytes);
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  cdict->dictContentType = dictContentType;
  pUVar2 = (U32 *)ZSTD_cwksp_reserve_object(&cdict->workspace,0x1900);
  cdict->entropyWorkspace = pUVar2;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  cdict_local = (ZSTD_CDict *)
                ZSTD_reset_matchState
                          (&cdict->matchState,&cdict->workspace,&params.cParams,
                           params.useRowMatchFinder,ZSTDcrp_makeClean,ZSTDirp_reset,
                           ZSTD_resetTarget_CDict);
  uVar1 = ERR_isError((size_t)cdict_local);
  if (uVar1 == 0) {
    params.fParams.contentSizeFlag = 1;
    cdict_local = (ZSTD_CDict *)
                  ZSTD_compress_insertDictionary
                            (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,
                             &cdict->workspace,&params,cdict->dictContent,cdict->dictContentSize,
                             dictContentType,ZSTD_dtlm_full,cdict->entropyWorkspace);
    uVar1 = ERR_isError((size_t)cdict_local);
    if (uVar1 == 0) {
      cdict->dictID = (U32)cdict_local;
      cdict_local = (ZSTD_CDict *)0x0;
    }
  }
  return (size_t)cdict_local;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}